

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::AsinOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  float rangeMax;
  float rangeMin;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < -1.5707964) || (1.5707964 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    fVar1 = deFloatMax(outMin,-1.5707964);
    fVar1 = ::deFloatSin(fVar1);
    *inMin = fVar1;
    fVar1 = deFloatMin(outMax,1.5707964);
    fVar1 = ::deFloatSin(fVar1);
    *inMax = fVar1;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		const float rangeMin = -DE_PI/2.0f;
		const float rangeMax = +DE_PI/2.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatSin(deFloatMax(outMin, rangeMin));
		inMax = deFloatSin(deFloatMin(outMax, rangeMax));

		return true;
	}